

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.cpp
# Opt level: O2

Optional<llvm::ReplacementItem> * __thiscall
llvm::formatv_object_base::parseReplacementItem
          (Optional<llvm::ReplacementItem> *__return_storage_ptr__,formatv_object_base *this,
          StringRef Spec)

{
  uint __line;
  type_conflict1 tVar1;
  char cVar2;
  bool bVar3;
  char *__assertion;
  StringRef SVar4;
  StringRef Chars;
  StringRef Chars_00;
  StringRef Chars_01;
  StringRef Chars_02;
  StringRef Chars_03;
  StringRef local_78;
  undefined1 auStack_68 [8];
  StringRef Spec_local;
  size_t Index;
  size_t Align;
  AlignStyle local_30;
  char local_29;
  AlignStyle Where;
  char Pad;
  
  Spec_local.Data = Spec.Data;
  SVar4.Length = 2;
  SVar4.Data = "{}";
  auStack_68 = (undefined1  [8])this;
  _Align = StringRef::trim((StringRef *)auStack_68,SVar4);
  local_29 = ' ';
  Index = 0;
  local_30 = Right;
  Spec_local.Length = 0;
  Chars.Length = 6;
  Chars.Data = " \t\n\v\f\r";
  _Align = StringRef::trim((StringRef *)&Align,Chars);
  tVar1 = StringRef::consumeInteger<unsigned_long>((StringRef *)&Align,0,&Spec_local.Length);
  if (tVar1) {
    __assertion = "false && \"Invalid replacement sequence index!\"";
    __line = 0x45;
  }
  else {
    Chars_00.Length = 6;
    Chars_00.Data = " \t\n\v\f\r";
    _Align = StringRef::trim((StringRef *)&Align,Chars_00);
    if (Align._8_8_ != 0) {
      cVar2 = StringRef::front((StringRef *)&Align);
      if (cVar2 == ',') {
        _Align = StringRef::drop_front((StringRef *)&Align,1);
        bVar3 = consumeFieldLayout((StringRef *)&Align,&local_30,&Index,&local_29);
        if (!bVar3) {
          __assertion = "false && \"Invalid replacement field layout specification!\"";
          __line = 0x4c;
          goto LAB_00dba16e;
        }
      }
    }
    Chars_01.Length = 6;
    Chars_01.Data = " \t\n\v\f\r";
    _Align = StringRef::trim((StringRef *)&Align,Chars_01);
    if (Align._8_8_ == 0) {
      SVar4 = (StringRef)ZEXT816(0);
    }
    else {
      cVar2 = StringRef::front((StringRef *)&Align);
      SVar4 = (StringRef)ZEXT816(0);
      if (cVar2 == ':') {
        local_78 = StringRef::drop_front((StringRef *)&Align,1);
        Chars_02.Length = 6;
        Chars_02.Data = " \t\n\v\f\r";
        SVar4 = StringRef::trim(&local_78,Chars_02);
        _Align = (StringRef)ZEXT816(0);
      }
    }
    Chars_03.Length = 6;
    Chars_03.Data = " \t\n\v\f\r";
    _Align = StringRef::trim((StringRef *)&Align,Chars_03);
    if (Align._8_8_ == 0) {
      (__return_storage_ptr__->Storage).field_0.value.Type = Format;
      (__return_storage_ptr__->Storage).field_0.value.Spec.Data = (char *)auStack_68;
      (__return_storage_ptr__->Storage).field_0.value.Spec.Length = (size_t)Spec_local.Data;
      (__return_storage_ptr__->Storage).field_0.value.Index = Spec_local.Length;
      (__return_storage_ptr__->Storage).field_0.value.Align = Index;
      (__return_storage_ptr__->Storage).field_0.value.Where = local_30;
      (__return_storage_ptr__->Storage).field_0.value.Pad = local_29;
      *(StringRef *)((long)&(__return_storage_ptr__->Storage).field_0 + 0x30) = SVar4;
      (__return_storage_ptr__->Storage).hasVal = true;
      return __return_storage_ptr__;
    }
    __assertion = "false && \"Unexpected characters found in replacement string!\"";
    __line = 0x55;
  }
LAB_00dba16e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/FormatVariadic.cpp"
                ,__line,
                "static Optional<ReplacementItem> llvm::formatv_object_base::parseReplacementItem(StringRef)"
               );
}

Assistant:

Optional<ReplacementItem>
formatv_object_base::parseReplacementItem(StringRef Spec) {
  StringRef RepString = Spec.trim("{}");

  // If the replacement sequence does not start with a non-negative integer,
  // this is an error.
  char Pad = ' ';
  std::size_t Align = 0;
  AlignStyle Where = AlignStyle::Right;
  StringRef Options;
  size_t Index = 0;
  RepString = RepString.trim();
  if (RepString.consumeInteger(0, Index)) {
    assert(false && "Invalid replacement sequence index!");
    return ReplacementItem{};
  }
  RepString = RepString.trim();
  if (!RepString.empty() && RepString.front() == ',') {
    RepString = RepString.drop_front();
    if (!consumeFieldLayout(RepString, Where, Align, Pad))
      assert(false && "Invalid replacement field layout specification!");
  }
  RepString = RepString.trim();
  if (!RepString.empty() && RepString.front() == ':') {
    Options = RepString.drop_front().trim();
    RepString = StringRef();
  }
  RepString = RepString.trim();
  if (!RepString.empty()) {
    assert(false && "Unexpected characters found in replacement string!");
  }

  return ReplacementItem{Spec, Index, Align, Where, Pad, Options};
}